

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O1

void fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  fe_t_conflict1 acc;
  fe_t_conflict1 t6;
  fe_t_conflict1 t3;
  fe_t_conflict1 t96;
  fe_t_conflict1 t48;
  fe_t_conflict1 t24;
  fe_t_conflict1 t200;
  fe_t_conflict1 t2;
  fe_t_conflict1 t12;
  fe_t_conflict1 t102;
  fe_t_conflict1 t502;
  fe_t_conflict1 t400;
  fe_t_conflict1 t198;
  uint64_t auStack_438 [10];
  uint64_t local_3e8 [10];
  uint64_t local_398 [10];
  uint64_t local_348 [10];
  uint64_t local_2f8 [10];
  uint64_t local_2a8 [10];
  uint64_t local_258 [10];
  uint64_t local_208 [10];
  uint64_t local_1b8 [10];
  uint64_t local_168 [10];
  uint64_t local_118 [10];
  uint64_t local_c8 [10];
  uint64_t local_78 [10];
  
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_208,auStack_438,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_208);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_398,auStack_438,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_398);
  iVar1 = 1;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_3e8,auStack_438,local_398);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_3e8);
  iVar1 = 5;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1b8,auStack_438,local_3e8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_1b8);
  iVar1 = 0xb;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_2a8,auStack_438,local_1b8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_2a8);
  iVar1 = 0x17;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_2f8,auStack_438,local_2a8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_2f8);
  iVar1 = 0x2f;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_348,auStack_438,local_2f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_348);
  iVar1 = 5;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_168,auStack_438,local_3e8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_168);
  iVar1 = 0x5f;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_78,auStack_438,local_348);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_78);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_258,auStack_438,local_208);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_258);
  iVar1 = 199;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_c8,auStack_438,local_258);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_c8);
  iVar1 = 0x65;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_118,auStack_438,local_168);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,local_118);
  iVar1 = 3;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(auStack_438,auStack_438,local_398);
  iVar1 = 4;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(auStack_438,auStack_438,t1);
  iVar1 = 1;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(auStack_438,auStack_438);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(output,auStack_438,t1);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(fe_t output,
                                                          const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t102, t12, t198, t2, t200, t24, t3, t400, t48, t502, t6, t96;

    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t2, acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t3, acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t3);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t6, acc, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t6);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t12, acc, t6);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t12);
    for (i = 0; i < 11; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t24, acc, t12);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t24);
    for (i = 0; i < 23; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t48, acc, t24);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t48);
    for (i = 0; i < 47; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t96, acc, t48);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t96);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t102, acc, t6);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t102);
    for (i = 0; i < 95; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t198, acc, t96);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t198);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t200, acc, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t200);
    for (i = 0; i < 199; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t400, acc, t200);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t400);
    for (i = 0; i < 101; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t502, acc, t102);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, t502);
    for (i = 0; i < 3; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(acc, acc, t3);
    for (i = 0; i < 4; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(acc, acc, t1);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(output, acc, t1);
}